

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlCheckCdataPush(xmlChar *utf,int len,int complete)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (len < 1 || utf == (xmlChar *)0x0) {
    return 0;
  }
  iVar3 = 0;
LAB_0016655c:
  do {
    while( true ) {
      while( true ) {
        iVar2 = iVar3;
        if (len <= iVar2) {
          return iVar2;
        }
        bVar1 = utf[iVar2];
        uVar4 = (uint)bVar1;
        if ((char)bVar1 < '\0') break;
        if ((bVar1 < 0x20) && ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0))))
        goto LAB_00166781;
        iVar3 = iVar2 + 1;
      }
      if ((uVar4 & 0xffffffe0) != 0xc0) break;
      iVar3 = iVar2 + 2;
      if (len < iVar3) goto LAB_00166785;
      if ((utf[(long)iVar2 + 1] & 0xffffffc0) != 0x80) goto LAB_00166781;
      uVar4 = (uVar4 & 0x1f) << 6;
      if (uVar4 < 0x100) {
        uVar4 = utf[(long)iVar2 + 1] & 0x3f | uVar4;
LAB_00166725:
        if ((uVar4 < 0x20) && ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0))))
        goto LAB_00166781;
      }
    }
    if ((uVar4 & 0xfffffff0) != 0xe0) break;
    iVar3 = iVar2 + 3;
    if (len < iVar3) goto LAB_00166785;
    if (((utf[(long)iVar2 + 1] & 0xc0) != 0x80) || ((utf[(long)iVar2 + 2] & 0xc0) != 0x80))
    goto LAB_00166781;
    uVar5 = (uVar4 & 0xf) << 0xc;
    uVar6 = (utf[(long)iVar2 + 1] & 0x3f) << 6 | uVar5;
    uVar4 = utf[(long)iVar2 + 2] & 0x3f | uVar6;
    if (uVar6 < 0x100) goto LAB_00166725;
    if ((0xd7ff < uVar6) && ((uVar5 < 0xe000 || (0xfffd < uVar4)))) goto LAB_00166781;
  } while( true );
  if ((uVar4 & 0xfffffff8) != 0xf0) {
LAB_00166781:
    return -iVar2;
  }
  iVar3 = iVar2 + 4;
  if (len < iVar3) {
LAB_00166785:
    if (complete != 0) {
      return -iVar2;
    }
    return iVar2;
  }
  if ((((utf[(long)iVar2 + 1] & 0xc0) != 0x80) || ((utf[(long)iVar2 + 2] & 0xffffffc0) != 0x80)) ||
     ((utf[(long)iVar2 + 3] & 0xc0) != 0x80)) goto LAB_00166781;
  uVar6 = (utf[(long)iVar2 + 1] & 0x3f) << 0xc | (uVar4 & 7) << 0x12;
  uVar5 = (utf[(long)iVar2 + 2] & 0x3f) << 6 | uVar6;
  uVar4 = utf[(long)iVar2 + 3] & 0x3f | uVar5;
  if (uVar5 < 0x100) goto LAB_00166725;
  if ((0xd7ff < uVar5) && (0xfffff < uVar6 - 0x10000 && (0xfffd < uVar4 || uVar6 < 0xe000)))
  goto LAB_00166781;
  goto LAB_0016655c;
}

Assistant:

static int
xmlCheckCdataPush(const xmlChar *utf, int len, int complete) {
    int ix;
    unsigned char c;
    int codepoint;

    if ((utf == NULL) || (len <= 0))
        return(0);

    for (ix = 0; ix < len;) {      /* string is 0-terminated */
        c = utf[ix];
        if ((c & 0x80) == 0x00) {	/* 1-byte code, starts with 10 */
	    if (c >= 0x20)
		ix++;
	    else if ((c == 0xA) || (c == 0xD) || (c == 0x9))
	        ix++;
	    else
	        return(-ix);
	} else if ((c & 0xe0) == 0xc0) {/* 2-byte code, starts with 110 */
	    if (ix + 2 > len) return(complete ? -ix : ix);
	    if ((utf[ix+1] & 0xc0 ) != 0x80)
	        return(-ix);
	    codepoint = (utf[ix] & 0x1f) << 6;
	    codepoint |= utf[ix+1] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 2;
	} else if ((c & 0xf0) == 0xe0) {/* 3-byte code, starts with 1110 */
	    if (ix + 3 > len) return(complete ? -ix : ix);
	    if (((utf[ix+1] & 0xc0) != 0x80) ||
	        ((utf[ix+2] & 0xc0) != 0x80))
		    return(-ix);
	    codepoint = (utf[ix] & 0xf) << 12;
	    codepoint |= (utf[ix+1] & 0x3f) << 6;
	    codepoint |= utf[ix+2] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 3;
	} else if ((c & 0xf8) == 0xf0) {/* 4-byte code, starts with 11110 */
	    if (ix + 4 > len) return(complete ? -ix : ix);
	    if (((utf[ix+1] & 0xc0) != 0x80) ||
	        ((utf[ix+2] & 0xc0) != 0x80) ||
		((utf[ix+3] & 0xc0) != 0x80))
		    return(-ix);
	    codepoint = (utf[ix] & 0x7) << 18;
	    codepoint |= (utf[ix+1] & 0x3f) << 12;
	    codepoint |= (utf[ix+2] & 0x3f) << 6;
	    codepoint |= utf[ix+3] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 4;
	} else				/* unknown encoding */
	    return(-ix);
      }
      return(ix);
}